

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O2

void add_one_and_zeros_padding(uchar *output,size_t output_len,size_t data_len)

{
  ulong uVar1;
  
  output[data_len] = 0x80;
  for (uVar1 = 1; uVar1 = uVar1 & 0xff, uVar1 < output_len - data_len;
      uVar1 = (ulong)((int)uVar1 + 1)) {
    output[uVar1 + data_len] = '\0';
  }
  return;
}

Assistant:

static void add_one_and_zeros_padding( unsigned char *output,
                                       size_t output_len, size_t data_len )
{
    size_t padding_len = output_len - data_len;
    unsigned char i = 0;

    output[data_len] = 0x80;
    for( i = 1; i < padding_len; i++ )
        output[data_len + i] = 0x00;
}